

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ostream * __thiscall
parser::Parser::dotStringify(Parser *this,ostream *out,Grammar *grammar,CanonicalSet *canonicalSet)

{
  pointer pGVar1;
  pointer pSVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pCVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  pointer pCVar9;
  ulong uVar10;
  long *plVar11;
  pointer lhs;
  ulong uVar12;
  pointer pSVar13;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  Situations goToSits;
  string local_b8;
  Grammar *local_98;
  long local_90;
  TerminalNames *local_88;
  NonTerminalNames *local_80;
  _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  local_78;
  Situations local_48;
  
  local_98 = grammar;
  std::__ostream_insert<char,std::char_traits<char>>(out,"digraph CanonicalSet {",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  pCVar5 = (canonicalSet->
           super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar9 = (canonicalSet->
           super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar9 != pCVar5) {
    uVar12 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"I",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[label=\"",8);
      pCVar5 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_start;
      poVar4 = out;
      if ((ulong)((long)(canonicalSet->
                        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 5) <= uVar12)
      {
LAB_001163c1:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
        goto LAB_001163d2;
      }
      poVar4 = (ostream *)(uVar12 * 0x20);
      plVar11 = *(long **)(poVar4 + (long)&pCVar5->situations);
      while (plVar11 !=
             *(long **)(poVar4 + (long)((long)&(pCVar5->situations).
                                               super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                               ._M_impl + 8))) {
        if (plVar11 != *(long **)(poVar4 + (long)&pCVar5->situations)) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        }
        (**(code **)(*plVar11 + 8))(plVar11,out,&this->terminalNames,&this->nonTerminalNames);
        plVar11 = plVar11 + 6;
        pCVar5 = (canonicalSet->
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(canonicalSet->
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 5) <= uVar12
           ) goto LAB_001163c1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\"]\n",3);
      uVar12 = uVar12 + 1;
      pCVar5 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pCVar9 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)pCVar9 - (long)pCVar5 >> 5));
  }
  if (pCVar9 != pCVar5) {
    local_80 = &this->nonTerminalNames;
    local_88 = &this->terminalNames;
    poVar4 = (ostream *)0x0;
    do {
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((ostream *)((long)pCVar9 - (long)pCVar5 >> 5) <= poVar4) {
LAB_001163d2:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   poVar4);
LAB_001163e3:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   poVar4);
LAB_001163f4:
        uVar8 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        std::
        _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
        ::~_Rb_tree(&local_78);
        _Unwind_Resume(uVar8);
      }
      pSVar13 = pCVar5[(long)poVar4].situations.
                super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                super__Vector_impl_data._M_start;
      while (pSVar13 !=
             pCVar5[(long)poVar4].situations.
             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        pGVar1 = (pSVar13->super_Convolution).body.
                 super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(pSVar13->super_Convolution).body.
                       super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3;
        uVar12 = pSVar13->point;
        if (uVar10 != uVar12) {
          if (uVar10 <= uVar12) goto LAB_001163f4;
          std::
          _Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
          ::_M_insert_unique<parser::GrammaticSymbol_const&>
                    ((_Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
                      *)&local_78,pGVar1 + uVar12);
          pCVar5 = (canonicalSet->
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pCVar9 = (canonicalSet->
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        pSVar13 = pSVar13 + 1;
        if ((ostream *)((long)pCVar9 - (long)pCVar5 >> 5) <= poVar4) goto LAB_001163d2;
      }
      p_Var7 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      local_90 = (long)poVar4 * 0x20;
      if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_78._M_impl.super__Rb_tree_header) {
        do {
          pCVar5 = (canonicalSet->
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ostream *)
              ((long)(canonicalSet->
                     super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 5) <= poVar4)
          goto LAB_001163e3;
          goTo(&local_48,this,local_98,
               (Situations *)
               ((long)&(pCVar5->situations).
                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                       _M_impl + local_90),(GrammaticSymbol *)(p_Var7 + 1));
          pCVar5 = (canonicalSet->
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((canonicalSet->
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
              _M_impl.super__Vector_impl_data._M_finish != pCVar5) {
            uVar12 = 0;
            do {
              pSVar2 = local_48.
                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pSVar13 = pCVar5[uVar12].situations.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lhs = local_48.
                    super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              if ((long)local_48.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                  (long)pCVar5[uVar12].situations.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar13) {
                for (; lhs != pSVar2; lhs = lhs + 1) {
                  bVar3 = operator==(&lhs->super_Convolution,&pSVar13->super_Convolution);
                  if (!bVar3 || lhs->point != pSVar13->point) goto LAB_00116321;
                  pSVar13 = pSVar13 + 1;
                }
                std::__ostream_insert<char,std::char_traits<char>>(out,"I",1);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"I",1);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," [label=\"",9);
                if (p_Var7[1].field_0x4 == '\x01') {
                  lexer::terminalName(&local_b8,p_Var7[1]._M_color,local_88);
                }
                else {
                  nonTerminalName(&local_b8,p_Var7[1]._M_color,local_80);
                }
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,local_b8._M_dataplus._M_p,local_b8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"]",2);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
              }
LAB_00116321:
              uVar12 = uVar12 + 1;
              pCVar5 = (canonicalSet->
                       super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            } while (uVar12 < (ulong)((long)(canonicalSet->
                                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pCVar5 >> 5));
          }
          std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_48);
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != &local_78._M_impl.super__Rb_tree_header);
      }
      std::
      _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
      ::~_Rb_tree(&local_78);
      poVar4 = poVar4 + 1;
      pCVar5 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pCVar9 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    } while (poVar4 < (ostream *)((long)pCVar9 - (long)pCVar5 >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return out;
}

Assistant:

std::ostream& dotStringify(std::ostream& out, Grammar const& grammar,
                                   CanonicalSet const& canonicalSet) {
            out << "digraph CanonicalSet {" << std::endl;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                out << "I" << i << "[label=\"";
                for_each_c(Situations, canonicalSet.at(i).situations, sit) {
                    if (sit != canonicalSet.at(i).situations.begin()) out  << "\n";
                    sit->stringify(out, terminalNames, nonTerminalNames);
                }
                out << "\"]\n";
            }

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                UniqueGrammaticSymbols uniqueGrammaticSymbols;
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    if (situation->body.size() == situation->point)
                        continue;
                    uniqueGrammaticSymbols.insert(situation->body.at(situation->point));
                }

                for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                    Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, *symbol);

                    for (size_t j = 0; j < canonicalSet.size(); ++j) {
                        if (goToSits == canonicalSet.at(j).situations) {
                            out << "I" << i << " -> " << "I" << j << " [label=\""
                              << (symbol->isTerminal ? lexer::terminalName(symbol->value, terminalNames)
                                                     : nonTerminalName(symbol->value, nonTerminalNames)) << "\"]" << std::endl;
                        }
                    }
                }
            }
            out << "}";
            return out;
        }